

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O0

reference __thiscall
bitdeque<32768>::Iterator<false>::operator[](Iterator<false> *this,difference_type pos)

{
  Iterator<false> *in_RDI;
  long in_FS_OFFSET;
  reference rVar1;
  Iterator<false> *this_00;
  Iterator<false> *x;
  Iterator<false> local_58 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = local_58;
  x = in_RDI;
  Iterator(this_00,in_RDI);
  ::operator+(x,(difference_type)this_00);
  rVar1 = operator*(x);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    rVar1._M_wp = (_WordT *)in_RDI;
    return rVar1;
  }
  __stack_chk_fail();
}

Assistant:

reference operator[](difference_type pos) const { return *(*this + pos); }